

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O0

int __thiscall SpinLock::SpinLoop(SpinLock *this)

{
  memory_order mVar1;
  __atomic_base<int> _Var2;
  bool bVar3;
  __atomic_base<int> local_70;
  int local_6c;
  int old;
  int c;
  SpinLock *this_local;
  memory_order local_58;
  int local_54;
  memory_order __b;
  undefined4 local_48;
  undefined4 local_44;
  __atomic_base<int> *local_40;
  SpinLock *local_38;
  
  local_6c = adaptive_spin_count;
  _old = this;
  while( true ) {
    local_54 = 0;
    ___b = this;
    local_58 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_54 - 1U < 2) {
      this_local._4_4_ = (this->lockword_).super___atomic_base<int>._M_i;
    }
    else if (local_54 == 5) {
      this_local._4_4_ = (this->lockword_).super___atomic_base<int>._M_i;
    }
    else {
      this_local._4_4_ = (this->lockword_).super___atomic_base<int>._M_i;
    }
    bVar3 = false;
    if (this_local._4_4_ != 0) {
      local_6c = local_6c + -1;
      bVar3 = 0 < local_6c;
    }
    if (!bVar3) break;
    anon_unknown.dwarf_4aa16::SpinlockPause();
  }
  local_70._M_i = 0;
  local_40 = &local_70;
  local_44 = 2;
  local_48 = 2;
  local_38 = this;
  mVar1 = std::__cmpexch_failure_order(memory_order_acquire);
  switch(0x139483) {
  default:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      _Var2._M_i = (this->lockword_).super___atomic_base<int>._M_i;
      bVar3 = local_70._M_i == _Var2._M_i;
      if (bVar3) {
        (this->lockword_).super___atomic_base<int>._M_i = 2;
        _Var2._M_i = local_70._M_i;
      }
      UNLOCK();
      if (!bVar3) {
        local_70._M_i = _Var2._M_i;
      }
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      _Var2._M_i = (this->lockword_).super___atomic_base<int>._M_i;
      bVar3 = local_70._M_i == _Var2._M_i;
      if (bVar3) {
        (this->lockword_).super___atomic_base<int>._M_i = 2;
        _Var2._M_i = local_70._M_i;
      }
      UNLOCK();
      if (!bVar3) {
        local_70._M_i = _Var2._M_i;
      }
    }
    else {
      LOCK();
      _Var2._M_i = (this->lockword_).super___atomic_base<int>._M_i;
      bVar3 = local_70._M_i == _Var2._M_i;
      if (bVar3) {
        (this->lockword_).super___atomic_base<int>._M_i = 2;
        _Var2._M_i = local_70._M_i;
      }
      UNLOCK();
      if (!bVar3) {
        local_70._M_i = _Var2._M_i;
      }
    }
    break;
  case 2:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      _Var2._M_i = (this->lockword_).super___atomic_base<int>._M_i;
      bVar3 = local_70._M_i == _Var2._M_i;
      if (bVar3) {
        (this->lockword_).super___atomic_base<int>._M_i = 2;
        _Var2._M_i = local_70._M_i;
      }
      UNLOCK();
      if (!bVar3) {
        local_70._M_i = _Var2._M_i;
      }
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      _Var2._M_i = (this->lockword_).super___atomic_base<int>._M_i;
      bVar3 = local_70._M_i == _Var2._M_i;
      if (bVar3) {
        (this->lockword_).super___atomic_base<int>._M_i = 2;
        _Var2._M_i = local_70._M_i;
      }
      UNLOCK();
      if (!bVar3) {
        local_70._M_i = _Var2._M_i;
      }
    }
    else {
      LOCK();
      _Var2._M_i = (this->lockword_).super___atomic_base<int>._M_i;
      bVar3 = local_70._M_i == _Var2._M_i;
      if (bVar3) {
        (this->lockword_).super___atomic_base<int>._M_i = 2;
        _Var2._M_i = local_70._M_i;
      }
      UNLOCK();
      if (!bVar3) {
        local_70._M_i = _Var2._M_i;
      }
    }
    break;
  case 3:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      _Var2._M_i = (this->lockword_).super___atomic_base<int>._M_i;
      bVar3 = local_70._M_i == _Var2._M_i;
      if (bVar3) {
        (this->lockword_).super___atomic_base<int>._M_i = 2;
        _Var2._M_i = local_70._M_i;
      }
      UNLOCK();
      if (!bVar3) {
        local_70._M_i = _Var2._M_i;
      }
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      _Var2._M_i = (this->lockword_).super___atomic_base<int>._M_i;
      bVar3 = local_70._M_i == _Var2._M_i;
      if (bVar3) {
        (this->lockword_).super___atomic_base<int>._M_i = 2;
        _Var2._M_i = local_70._M_i;
      }
      UNLOCK();
      if (!bVar3) {
        local_70._M_i = _Var2._M_i;
      }
    }
    else {
      LOCK();
      _Var2._M_i = (this->lockword_).super___atomic_base<int>._M_i;
      bVar3 = local_70._M_i == _Var2._M_i;
      if (bVar3) {
        (this->lockword_).super___atomic_base<int>._M_i = 2;
        _Var2._M_i = local_70._M_i;
      }
      UNLOCK();
      if (!bVar3) {
        local_70._M_i = _Var2._M_i;
      }
    }
    break;
  case 4:
    if (mVar1 - memory_order_consume < 2) {
      LOCK();
      _Var2._M_i = (this->lockword_).super___atomic_base<int>._M_i;
      bVar3 = local_70._M_i == _Var2._M_i;
      if (bVar3) {
        (this->lockword_).super___atomic_base<int>._M_i = 2;
        _Var2._M_i = local_70._M_i;
      }
      UNLOCK();
      if (!bVar3) {
        local_70._M_i = _Var2._M_i;
      }
    }
    else if (mVar1 == memory_order_seq_cst) {
      LOCK();
      _Var2._M_i = (this->lockword_).super___atomic_base<int>._M_i;
      bVar3 = local_70._M_i == _Var2._M_i;
      if (bVar3) {
        (this->lockword_).super___atomic_base<int>._M_i = 2;
        _Var2._M_i = local_70._M_i;
      }
      UNLOCK();
      if (!bVar3) {
        local_70._M_i = _Var2._M_i;
      }
    }
    else {
      LOCK();
      _Var2._M_i = (this->lockword_).super___atomic_base<int>._M_i;
      bVar3 = local_70._M_i == _Var2._M_i;
      if (bVar3) {
        (this->lockword_).super___atomic_base<int>._M_i = 2;
        _Var2._M_i = local_70._M_i;
      }
      UNLOCK();
      if (!bVar3) {
        local_70._M_i = _Var2._M_i;
      }
    }
  }
  return local_70._M_i;
}

Assistant:

int SpinLock::SpinLoop() {
  int c = adaptive_spin_count;
  while (lockword_.load(std::memory_order_relaxed) != kSpinLockFree && --c > 0) {
    SpinlockPause();
  }
  int old = kSpinLockFree;
  lockword_.compare_exchange_strong(old, kSpinLockSleeper, std::memory_order_acquire);
  // note, that we try to set lock word to 'have sleeper' state might
  // look unnecessary, but:
  //
  // *) pay attention to second call to SpinLoop at the bottom of SlowLock loop below
  //
  // *) note, that we get there after sleeping in SpinLockDelay and
  //    getting woken by Unlock
  //
  // *) also note, that we don't "count" sleepers, so when unlock
  //    awakes us, it also sets lock word to "free". So we risk
  //    forgetting other sleepers. And to prevent this, we become
  //    "designated waker", by setting lock word to "have sleeper". So
  //    then when we unlock, we also wake up someone.
  return old;
}